

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::ReadDeferredStubs
          (ByteCodeBufferReader *this,byte *current,ByteCodeCache *cache,uint nestedCount,
          Type *deferredStubs,bool recurse)

{
  DeferredFunctionStub *pDVar1;
  undefined8 uVar2;
  Type TVar3;
  Type TVar4;
  undefined8 uVar5;
  Type TVar6;
  undefined8 uVar7;
  Recycler *pRVar8;
  DeferredFunctionStub *pDVar9;
  byte *pbVar10;
  int *ptr;
  long lVar11;
  uint j;
  ulong uVar12;
  ulong uVar13;
  Type *value;
  ulong count;
  undefined1 local_90 [8];
  TrackAllocData data;
  
  if (nestedCount != 0) {
    count = (ulong)nestedCount;
    local_90 = (undefined1  [8])&DeferredFunctionStub::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_36c6a8a;
    data.filename._0_4_ = 0x11cd;
    data.plusSize = count;
    pRVar8 = Memory::Recycler::TrackAllocInfo
                       (this->scriptContext->recycler,(TrackAllocData *)local_90);
    pDVar9 = Memory::AllocateArray<Memory::Recycler,DeferredFunctionStub,false>
                       ((Memory *)pRVar8,(Recycler *)Memory::Recycler::Alloc,0,count);
    Memory::WriteBarrierPtr<DeferredFunctionStub>::WriteBarrierSet(deferredStubs,pDVar9);
    for (uVar13 = 0; uVar13 != count; uVar13 = uVar13 + 1) {
      pDVar1 = deferredStubs->ptr;
      data._32_8_ = pDVar1 + uVar13;
      Memory::WriteBarrierPtr<Js::ByteCodeCache>::WriteBarrierSet
                (&pDVar1[uVar13].byteCodeCache,cache);
      pbVar10 = ReadUInt32(this,current,&pDVar1[uVar13].ichMin);
      pDVar9 = pDVar1 + uVar13;
      pbVar10 = ReadUInt32(this,pbVar10,&pDVar9->fncFlags);
      uVar2 = *(undefined8 *)pbVar10;
      TVar3 = *(Type *)(pbVar10 + 8);
      TVar4 = *(Type *)(pbVar10 + 0x10);
      uVar5 = *(undefined8 *)(pbVar10 + 0x18);
      TVar6 = *(Type *)(pbVar10 + 0x20);
      uVar7 = *(undefined8 *)(pbVar10 + 0x28);
      (pDVar9->restorePoint).m_ichMinTok = (int)uVar2;
      (pDVar9->restorePoint).m_ichMinLine = (int)((ulong)uVar2 >> 0x20);
      (pDVar9->restorePoint).m_cMinTokMultiUnits = TVar3;
      (pDVar9->restorePoint).m_cMinLineMultiUnits = TVar4;
      (pDVar9->restorePoint).m_line = (int)uVar5;
      (pDVar9->restorePoint).functionIdIncrement = (int)((ulong)uVar5 >> 0x20);
      (pDVar9->restorePoint).lengthDecr = TVar6;
      *(undefined8 *)&(pDVar9->restorePoint).m_fHadEol = uVar7;
      (pDVar9->restorePoint).m_cMultiUnits = *(Type *)(pbVar10 + 0x30);
      value = &pDVar1[uVar13].capturedNameCount;
      pbVar10 = ReadUInt32(this,pbVar10 + 0x38,value);
      data.plusSize = (size_t)*value;
      local_90 = (undefined1  [8])&int::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_36c6a8a;
      data.filename._0_4_ = 0x11dd;
      pRVar8 = Memory::Recycler::TrackAllocInfo
                         (this->scriptContext->recycler,(TrackAllocData *)local_90);
      ptr = Memory::AllocateArray<Memory::Recycler,int,false>
                      ((Memory *)pRVar8,(Recycler *)Memory::Recycler::Alloc,0,(ulong)*value);
      Memory::WriteBarrierPtr<int>::WriteBarrierSet(&pDVar1[uVar13].capturedNameSerializedIds,ptr);
      lVar11 = 0;
      for (uVar12 = 0; uVar2 = data._32_8_, uVar12 < *value; uVar12 = uVar12 + 1) {
        pbVar10 = ReadInt32(this,pbVar10,
                            (int *)((long)pDVar1[uVar13].capturedNameSerializedIds.ptr + lVar11));
        lVar11 = lVar11 + 4;
      }
      current = ReadUInt32(this,pbVar10,(uint *)(data._32_8_ + 0x3c));
      if (recurse) {
        current = ReadDeferredStubs(this,current,cache,*(uint *)(uVar2 + 0x3c),
                                    (Type *)(uVar2 + 0x58),true);
      }
    }
  }
  return current;
}

Assistant:

const byte* ReadDeferredStubs(const byte* current, ByteCodeCache* cache, uint nestedCount, Field(DeferredFunctionStub*)* deferredStubs, bool recurse)
    {
        if (nestedCount == 0)
        {
            return current;
        }

        *deferredStubs = RecyclerNewArray(this->scriptContext->GetRecycler(), DeferredFunctionStub, nestedCount);

        for (uint i = 0; i < nestedCount; i++)
        {
            DeferredFunctionStub* nestedStub = *deferredStubs + i;

            nestedStub->byteCodeCache = cache;

            current = ReadUInt32(current, &nestedStub->ichMin);
            current = ReadUInt32(current, (uint*)&nestedStub->fncFlags);

            serialization_alignment RestorePoint* restorePoint;
            current = ReadStruct<RestorePoint>(current, &restorePoint);
            nestedStub->restorePoint = *restorePoint;

            current = ReadUInt32(current, &nestedStub->capturedNameCount);
            nestedStub->capturedNameSerializedIds = RecyclerNewArray(this->scriptContext->GetRecycler(), int, nestedStub->capturedNameCount);
            for (uint j = 0; j < nestedStub->capturedNameCount; j++)
            {
                current = ReadInt32(current, &nestedStub->capturedNameSerializedIds[j]);
            }

            current = ReadUInt32(current, &nestedStub->nestedCount);

            if (recurse)
            {
                current = ReadDeferredStubs(current, cache, nestedStub->nestedCount, &nestedStub->deferredStubs, recurse);
            }
        }

        return current;
    }